

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdLocal.c
# Opt level: O0

DdNode * Dsd_TreeGetPrimeFunction(DdManager *dd,Dsd_Node_t *pNode)

{
  int iVar1;
  int *permut;
  int *pVar2Form_00;
  int *pForm2Var_00;
  DdNode **pbCube0_00;
  DdNode **pbCube1_00;
  DdNode *pDVar2;
  DdNode *pDVar3;
  st__table *pCache_00;
  DdNode *pDVar4;
  st__table *pCache;
  DdNode *bTemp;
  DdNode *bRes;
  DdNode *bFunc;
  DdNode **pbCube1;
  DdNode **pbCube0;
  int *pPermute;
  int iLev;
  int iVar;
  int i;
  int *pVar2Form;
  int *pForm2Var;
  Dsd_Node_t *pNode_local;
  DdManager *dd_local;
  
  permut = (int *)malloc((long)dd->size << 2);
  pVar2Form_00 = (int *)malloc((long)dd->size << 2);
  pForm2Var_00 = (int *)malloc((long)dd->size << 2);
  pbCube0_00 = (DdNode **)malloc((long)dd->size << 3);
  pbCube1_00 = (DdNode **)malloc((long)dd->size << 3);
  pPermute._4_4_ = 0;
  for (iLev = 0; iLev < pNode->nDecs; iLev = iLev + 1) {
    pForm2Var_00[iLev] = dd->invperm[iLev];
    for (pCache = (st__table *)pNode->pDecs[iLev]->S; pCache != (st__table *)dd->one;
        pCache = *(st__table **)&pCache->num_bins) {
      iVar1 = dd->invperm[pPermute._4_4_];
      permut[*(uint *)&pCache->compare] = iVar1;
      pVar2Form_00[iVar1] = iLev;
      pPermute._4_4_ = pPermute._4_4_ + 1;
    }
    pDVar2 = Extra_bddGetOneCube(dd,(DdNode *)((ulong)pNode->pDecs[iLev]->G ^ 1));
    pbCube0_00[iLev] = pDVar2;
    Cudd_Ref(pbCube0_00[iLev]);
    pDVar2 = Extra_bddGetOneCube(dd,pNode->pDecs[iLev]->G);
    pbCube1_00[iLev] = pDVar2;
    Cudd_Ref(pbCube1_00[iLev]);
  }
  pDVar2 = Cudd_bddPermute(dd,pNode->G,permut);
  Cudd_Ref(pDVar2);
  for (iLev = 0; iLev < pNode->nDecs; iLev = iLev + 1) {
    pDVar4 = pbCube0_00[iLev];
    pDVar3 = Cudd_bddPermute(dd,pDVar4,permut);
    pbCube0_00[iLev] = pDVar3;
    Cudd_Ref(pbCube0_00[iLev]);
    Cudd_RecursiveDeref(dd,pDVar4);
    pDVar4 = pbCube1_00[iLev];
    pDVar3 = Cudd_bddPermute(dd,pDVar4,permut);
    pbCube1_00[iLev] = pDVar3;
    Cudd_Ref(pbCube1_00[iLev]);
    Cudd_RecursiveDeref(dd,pDVar4);
  }
  pCache_00 = st__init_table(st__ptrcmp,st__ptrhash);
  pDVar4 = Extra_dsdRemap(dd,pDVar2,pCache_00,pVar2Form_00,pForm2Var_00,pbCube0_00,pbCube1_00);
  Cudd_Ref(pDVar4);
  st__free_table(pCache_00);
  Cudd_RecursiveDeref(dd,pDVar2);
  for (iLev = 0; iLev < pNode->nDecs; iLev = iLev + 1) {
    Cudd_RecursiveDeref(dd,pbCube0_00[iLev]);
    Cudd_RecursiveDeref(dd,pbCube1_00[iLev]);
  }
  if (permut != (int *)0x0) {
    free(permut);
  }
  if (pVar2Form_00 != (int *)0x0) {
    free(pVar2Form_00);
  }
  if (pForm2Var_00 != (int *)0x0) {
    free(pForm2Var_00);
  }
  if (pbCube0_00 != (DdNode **)0x0) {
    free(pbCube0_00);
  }
  if (pbCube1_00 != (DdNode **)0x0) {
    free(pbCube1_00);
  }
  Cudd_Deref(pDVar4);
  return pDVar4;
}

Assistant:

DdNode * Dsd_TreeGetPrimeFunction( DdManager * dd, Dsd_Node_t * pNode ) 
{
    int * pForm2Var;   // the mapping of each formal input into its first var
    int * pVar2Form;   // the mapping of each var into its formal inputs
    int i, iVar, iLev, * pPermute;
    DdNode ** pbCube0, ** pbCube1;
    DdNode * bFunc, * bRes, * bTemp;
    st__table * pCache;
    
    pPermute  = ABC_ALLOC( int, dd->size );
    pVar2Form = ABC_ALLOC( int, dd->size );
    pForm2Var = ABC_ALLOC( int, dd->size );

    pbCube0 = ABC_ALLOC( DdNode *, dd->size );
    pbCube1 = ABC_ALLOC( DdNode *, dd->size );

    // remap the global function in such a way that
    // the support variables of each formal input are adjacent
    iLev = 0;
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        pForm2Var[i] = dd->invperm[i];
        for ( bTemp = pNode->pDecs[i]->S; bTemp != b1; bTemp = cuddT(bTemp) )
        {
            iVar = dd->invperm[iLev];
            pPermute[bTemp->index] = iVar;
            pVar2Form[iVar] = i;
            iLev++;
        }

        // collect the cubes representing each assignment
        pbCube0[i] = Extra_bddGetOneCube( dd, Cudd_Not(pNode->pDecs[i]->G) );
        Cudd_Ref( pbCube0[i] );
        pbCube1[i] = Extra_bddGetOneCube( dd, pNode->pDecs[i]->G );
        Cudd_Ref( pbCube1[i] );
    }

    // remap the function
    bFunc = Cudd_bddPermute( dd, pNode->G, pPermute ); Cudd_Ref( bFunc );
    // remap the cube
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        pbCube0[i] = Cudd_bddPermute( dd, bTemp = pbCube0[i], pPermute ); Cudd_Ref( pbCube0[i] );
        Cudd_RecursiveDeref( dd, bTemp );
        pbCube1[i] = Cudd_bddPermute( dd, bTemp = pbCube1[i], pPermute ); Cudd_Ref( pbCube1[i] );
        Cudd_RecursiveDeref( dd, bTemp );
    }

    // remap the function
    pCache = st__init_table( st__ptrcmp, st__ptrhash);;
    bRes = Extra_dsdRemap( dd, bFunc, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 );  Cudd_Ref( bRes );
    st__free_table( pCache );

    Cudd_RecursiveDeref( dd, bFunc );
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        Cudd_RecursiveDeref( dd, pbCube0[i] );
        Cudd_RecursiveDeref( dd, pbCube1[i] );
    }
/*
////////////
    // permute the function once again
    // in such a way that i-th var stood for i-th formal input
    for ( i = 0; i < dd->size; i++ )
        pPermute[i] = -1;
    for ( i = 0; i < pNode->nDecs; i++ )
        pPermute[dd->invperm[i]] = i;
    bRes = Cudd_bddPermute( dd, bTemp = bRes, pPermute ); Cudd_Ref( bRes );
    Cudd_RecursiveDeref( dd, bTemp );
////////////
*/
    ABC_FREE(pPermute);
    ABC_FREE(pVar2Form);
    ABC_FREE(pForm2Var);
    ABC_FREE(pbCube0);
    ABC_FREE(pbCube1);

    Cudd_Deref( bRes );
    return bRes;
}